

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::ShaderOperatorTests::init(ShaderOperatorTests *this,EVP_PKEY_CTX *ctx)

{
  DataType dataType;
  Precision precision_00;
  float fVar1;
  Context *pCVar2;
  int iVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *pTVar5;
  InitialCalibration *pIVar6;
  TestNode *pTVar7;
  char *pcVar8;
  ostream *poVar9;
  BinaryOpCase *this_00;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  FunctionCase *this_01;
  char *pcVar10;
  bool bVar11;
  InitialCalibrationStorage *local_770;
  TestNode *local_718;
  DataType local_6e4;
  DataType local_6e0;
  DataType local_6dc;
  DataType local_6d8;
  DataType local_6d4;
  DataType local_6d0;
  DataType local_6cc;
  DataType local_6c8;
  DataType local_6c4;
  bool local_671;
  string local_5c8 [32];
  TestNode *local_5a8;
  TestCaseGroup *group;
  int local_598;
  int iStack_594;
  bool vert;
  int fragI;
  int i_3;
  ostringstream caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  byte local_3ea;
  allocator<char> local_3e9;
  undefined1 local_3e8 [8];
  string precisionPrefix;
  int prec;
  int i_2;
  DataType paramTypes [3];
  int typeArrayNdx;
  int inSize;
  int isMat;
  int isInt;
  int isBool;
  int isFloat;
  int i_1;
  DataType types [4];
  int curSize;
  int i;
  int genTypeLastSize;
  int genTypeFirstSize;
  SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  local_368;
  TestNode *local_358;
  TestCaseGroup *funcGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  PrecisionMask local_324;
  byte local_31e;
  byte local_31d;
  PrecisionMask precMask;
  bool booleanCase;
  bool useNearlyConstantInputs;
  Vec4 *pVStack_318;
  int modifyParamNdx;
  Vec4 *groupAttribute;
  ValueType *funcTypes;
  char *groupFunc;
  char *groupName;
  TestCaseGroup *parentGroup;
  undefined1 local_2e8 [4];
  int funcNdx;
  InitialCalibrationStorage fragmentSubGroupCalibrationStorage;
  InitialCalibrationStorage vertexSubGroupCalibrationStorage;
  TestCaseGroup *fragmentSubGroup;
  TestCaseGroup *vertexSubGroup;
  Vec4 attrBig;
  Vec4 attrSmall;
  Vec4 attrNegPos;
  Vec4 attrPos;
  TestCaseGroup *boolCompareGroup;
  TestCaseGroup *intCompareGroup;
  TestCaseGroup *floatCompareGroup;
  TestCaseGroup *matrixFunctionsGroup;
  TestCaseGroup *geometricFunctionsGroup;
  TestCaseGroup *commonFunctionsGroup;
  TestCaseGroup *exponentialGroup;
  TestCaseGroup *angleAndTrigonometryGroup;
  string local_230 [32];
  undefined1 local_210 [8];
  ostringstream name;
  bool useSwizzle;
  char *op;
  Precision precision;
  DataType type;
  int precNdx;
  int typeNdx;
  TestCaseGroup *shaderGroup;
  undefined1 local_68 [7];
  bool isVertex;
  InitialCalibrationStorage shaderGroupCalibrationStorage;
  int isFrag;
  TestCaseGroup *opGroup;
  int opNdx;
  TestCaseGroup *binaryOpsGroup;
  ShaderOperatorTests *this_local;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "binary_operator","Binary Operator Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (opGroup._0_4_ = 0; (int)opGroup < 4; opGroup._0_4_ = (int)opGroup + 1) {
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::binaryOps[(int)opGroup].name,"");
    tcu::TestNode::addChild(pTVar4,pTVar5);
    for (shaderGroupCalibrationStorage.m_state._4_4_ = 0;
        shaderGroupCalibrationStorage.m_state._4_4_ < 2;
        shaderGroupCalibrationStorage.m_state._4_4_ =
             shaderGroupCalibrationStorage.m_state._4_4_ + 1) {
      pIVar6 = (InitialCalibration *)operator_new(4);
      anon_unknown_1::OperatorPerformanceCase::InitialCalibration::InitialCalibration(pIVar6);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                   *)local_68,pIVar6);
      bVar11 = shaderGroupCalibrationStorage.m_state._4_4_ == 0;
      pTVar7 = (TestNode *)operator_new(0x70);
      pcVar10 = "Vertex and fragment";
      if (bVar11) {
        pcVar10 = "Unexpected vertex";
      }
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pcVar10 + 0xb,"");
      tcu::TestNode::addChild(pTVar5,pTVar7);
      for (type = TYPE_INVALID; (int)type < 8; type = type + TYPE_FLOAT) {
        for (precision = PRECISION_LOWP; (int)precision < 3;
            precision = precision + PRECISION_MEDIUMP) {
          dataType = init::binaryOpTypes[(int)type];
          precision_00 = init::precisions[(int)precision];
          pcVar10 = init::binaryOps[(int)opGroup].op;
          name._375_1_ = init::binaryOps[(int)opGroup].swizzle & 1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
          pcVar8 = glu::getPrecisionName(precision_00);
          poVar9 = std::operator<<((ostream *)local_210,pcVar8);
          poVar9 = std::operator<<(poVar9,"_");
          pcVar8 = glu::getDataTypeName(dataType);
          std::operator<<(poVar9,pcVar8);
          this_00 = (BinaryOpCase *)operator_new(0x1d8);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::BinaryOpCase::BinaryOpCase
                    (this_00,pCVar2,pcVar8,"",pcVar10,dataType,precision_00,(bool)(name._375_1_ & 1)
                     ,bVar11,(InitialCalibrationStorage *)local_68);
          tcu::TestNode::addChild(pTVar7,(TestNode *)this_00);
          std::__cxx11::string::~string(local_230);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
        }
      }
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::~SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                    *)local_68);
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "angle_and_trigonometry","Built-In Angle and Trigonometry Function Performance Tests");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"exponential",
             "Built-In Exponential Function Performance Tests");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "common_functions","Built-In Common Function Performance Tests");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"geometric",
             "Built-In Geometric Function Performance Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"matrix",
             "Built-In Matrix Function Performance Tests");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "float_compare","Built-In Floating Point Comparison Function Performance Tests");
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"int_compare",
             "Built-In Integer Comparison Function Performance Tests");
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bool_compare"
             ,"Built-In Boolean Comparison Function Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  tcu::TestNode::addChild((TestNode *)this,node_02);
  tcu::TestNode::addChild((TestNode *)this,node_03);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attrNegPos.m_data + 2),2.3,1.9,0.8,0.7);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attrSmall.m_data + 2),-1.3,2.5,-3.5,4.3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attrBig.m_data + 2),-0.9,0.8,-0.4,0.2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertexSubGroup,1.3,2.4,3.0,4.0);
  if ((init()::functionCaseGroups == '\0') &&
     (iVar3 = __cxa_guard_acquire(&init()::functionCaseGroups), iVar3 != 0)) {
    init::functionCaseGroups[0].groupName = "radians";
    init::functionCaseGroups[0].func = "radians";
    init::functionCaseGroups[0].types[0] = F;
    init::functionCaseGroups[0].types[1] = F;
    init::functionCaseGroups[0].types[2] = N;
    init::functionCaseGroups[0].types[3] = N;
    init::functionCaseGroups[0].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0].modifyParamNdx = -1;
    init::functionCaseGroups[0].useNearlyConstantInputs = false;
    init::functionCaseGroups[0].booleanCase = false;
    init::functionCaseGroups[0].precMask = PRECMASK_ALL;
    init::functionCaseGroups[1].groupName = "degrees";
    init::functionCaseGroups[1].func = "degrees";
    init::functionCaseGroups[1].types[0] = F;
    init::functionCaseGroups[1].types[1] = F;
    init::functionCaseGroups[1].types[2] = N;
    init::functionCaseGroups[1].types[3] = N;
    init::functionCaseGroups[1].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[1].modifyParamNdx = -1;
    init::functionCaseGroups[1].useNearlyConstantInputs = false;
    init::functionCaseGroups[1].booleanCase = false;
    init::functionCaseGroups[1].precMask = PRECMASK_ALL;
    init::functionCaseGroups[2].groupName = "sin";
    init::functionCaseGroups[2].func = "sin";
    init::functionCaseGroups[2].types[0] = F;
    init::functionCaseGroups[2].types[1] = F;
    init::functionCaseGroups[2].types[2] = N;
    init::functionCaseGroups[2].types[3] = N;
    init::functionCaseGroups[2].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[2].modifyParamNdx = -1;
    init::functionCaseGroups[2].useNearlyConstantInputs = false;
    init::functionCaseGroups[2].booleanCase = false;
    init::functionCaseGroups[2].precMask = PRECMASK_ALL;
    init::functionCaseGroups[3].groupName = "cos";
    init::functionCaseGroups[3].func = "cos";
    init::functionCaseGroups[3].types[0] = F;
    init::functionCaseGroups[3].types[1] = F;
    init::functionCaseGroups[3].types[2] = N;
    init::functionCaseGroups[3].types[3] = N;
    init::functionCaseGroups[3].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[3].modifyParamNdx = -1;
    init::functionCaseGroups[3].useNearlyConstantInputs = false;
    init::functionCaseGroups[3].booleanCase = false;
    init::functionCaseGroups[3].precMask = PRECMASK_ALL;
    init::functionCaseGroups[4].groupName = "tan";
    init::functionCaseGroups[4].func = "tan";
    init::functionCaseGroups[4].types[0] = F;
    init::functionCaseGroups[4].types[1] = F;
    init::functionCaseGroups[4].types[2] = N;
    init::functionCaseGroups[4].types[3] = N;
    init::functionCaseGroups[4].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[4].modifyParamNdx = -1;
    init::functionCaseGroups[4].useNearlyConstantInputs = false;
    init::functionCaseGroups[4].booleanCase = false;
    init::functionCaseGroups[4].precMask = PRECMASK_ALL;
    init::functionCaseGroups[5].groupName = "asin";
    init::functionCaseGroups[5].func = "asin";
    init::functionCaseGroups[5].types[0] = F;
    init::functionCaseGroups[5].types[1] = F;
    init::functionCaseGroups[5].types[2] = N;
    init::functionCaseGroups[5].types[3] = N;
    init::functionCaseGroups[5].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[5].modifyParamNdx = -1;
    init::functionCaseGroups[5].useNearlyConstantInputs = true;
    init::functionCaseGroups[5].booleanCase = false;
    init::functionCaseGroups[5].precMask = PRECMASK_ALL;
    init::functionCaseGroups[6].groupName = "acos";
    init::functionCaseGroups[6].func = "acos";
    init::functionCaseGroups[6].types[0] = F;
    init::functionCaseGroups[6].types[1] = F;
    init::functionCaseGroups[6].types[2] = N;
    init::functionCaseGroups[6].types[3] = N;
    init::functionCaseGroups[6].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[6].modifyParamNdx = -1;
    init::functionCaseGroups[6].useNearlyConstantInputs = true;
    init::functionCaseGroups[6].booleanCase = false;
    init::functionCaseGroups[6].precMask = PRECMASK_ALL;
    init::functionCaseGroups[7].groupName = "atan2";
    init::functionCaseGroups[7].func = "atan";
    init::functionCaseGroups[7].types[0] = F;
    init::functionCaseGroups[7].types[1] = F;
    init::functionCaseGroups[7].types[2] = F;
    init::functionCaseGroups[7].types[3] = N;
    init::functionCaseGroups[7].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[7].modifyParamNdx = -1;
    init::functionCaseGroups[7].useNearlyConstantInputs = false;
    init::functionCaseGroups[7].booleanCase = false;
    init::functionCaseGroups[7].precMask = PRECMASK_ALL;
    init::functionCaseGroups[8].groupName = "atan";
    init::functionCaseGroups[8].func = "atan";
    init::functionCaseGroups[8].types[0] = F;
    init::functionCaseGroups[8].types[1] = F;
    init::functionCaseGroups[8].types[2] = N;
    init::functionCaseGroups[8].types[3] = N;
    init::functionCaseGroups[8].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[8].modifyParamNdx = -1;
    init::functionCaseGroups[8].useNearlyConstantInputs = false;
    init::functionCaseGroups[8].booleanCase = false;
    init::functionCaseGroups[8].precMask = PRECMASK_ALL;
    init::functionCaseGroups[9].groupName = "sinh";
    init::functionCaseGroups[9].func = "sinh";
    init::functionCaseGroups[9].types[0] = F;
    init::functionCaseGroups[9].types[1] = F;
    init::functionCaseGroups[9].types[2] = N;
    init::functionCaseGroups[9].types[3] = N;
    init::functionCaseGroups[9].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[9].modifyParamNdx = -1;
    init::functionCaseGroups[9].useNearlyConstantInputs = false;
    init::functionCaseGroups[9].booleanCase = false;
    init::functionCaseGroups[9].precMask = PRECMASK_ALL;
    init::functionCaseGroups[10].groupName = "cosh";
    init::functionCaseGroups[10].func = "cosh";
    init::functionCaseGroups[10].types[0] = F;
    init::functionCaseGroups[10].types[1] = F;
    init::functionCaseGroups[10].types[2] = N;
    init::functionCaseGroups[10].types[3] = N;
    init::functionCaseGroups[10].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[10].modifyParamNdx = -1;
    init::functionCaseGroups[10].useNearlyConstantInputs = false;
    init::functionCaseGroups[10].booleanCase = false;
    init::functionCaseGroups[10].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xb].groupName = "tanh";
    init::functionCaseGroups[0xb].func = "tanh";
    init::functionCaseGroups[0xb].types[0] = F;
    init::functionCaseGroups[0xb].types[1] = F;
    init::functionCaseGroups[0xb].types[2] = N;
    init::functionCaseGroups[0xb].types[3] = N;
    init::functionCaseGroups[0xb].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0xb].modifyParamNdx = -1;
    init::functionCaseGroups[0xb].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xb].booleanCase = false;
    init::functionCaseGroups[0xb].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xc].groupName = "asinh";
    init::functionCaseGroups[0xc].func = "asinh";
    init::functionCaseGroups[0xc].types[0] = F;
    init::functionCaseGroups[0xc].types[1] = F;
    init::functionCaseGroups[0xc].types[2] = N;
    init::functionCaseGroups[0xc].types[3] = N;
    init::functionCaseGroups[0xc].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0xc].modifyParamNdx = -1;
    init::functionCaseGroups[0xc].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xc].booleanCase = false;
    init::functionCaseGroups[0xc].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xd].groupName = "acosh";
    init::functionCaseGroups[0xd].func = "acosh";
    init::functionCaseGroups[0xd].types[0] = F;
    init::functionCaseGroups[0xd].types[1] = F;
    init::functionCaseGroups[0xd].types[2] = N;
    init::functionCaseGroups[0xd].types[3] = N;
    init::functionCaseGroups[0xd].attribute = (Vec4 *)&vertexSubGroup;
    init::functionCaseGroups[0xd].modifyParamNdx = -1;
    init::functionCaseGroups[0xd].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xd].booleanCase = false;
    init::functionCaseGroups[0xd].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xe].groupName = "atanh";
    init::functionCaseGroups[0xe].func = "atanh";
    init::functionCaseGroups[0xe].types[0] = F;
    init::functionCaseGroups[0xe].types[1] = F;
    init::functionCaseGroups[0xe].types[2] = N;
    init::functionCaseGroups[0xe].types[3] = N;
    init::functionCaseGroups[0xe].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[0xe].modifyParamNdx = -1;
    init::functionCaseGroups[0xe].useNearlyConstantInputs = true;
    init::functionCaseGroups[0xe].booleanCase = false;
    init::functionCaseGroups[0xe].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0xf].groupName = "pow";
    init::functionCaseGroups[0xf].func = "pow";
    init::functionCaseGroups[0xf].types[0] = F;
    init::functionCaseGroups[0xf].types[1] = F;
    init::functionCaseGroups[0xf].types[2] = F;
    init::functionCaseGroups[0xf].types[3] = N;
    init::functionCaseGroups[0xf].attribute = (Vec4 *)(attrNegPos.m_data + 2);
    init::functionCaseGroups[0xf].modifyParamNdx = -1;
    init::functionCaseGroups[0xf].useNearlyConstantInputs = false;
    init::functionCaseGroups[0xf].booleanCase = false;
    init::functionCaseGroups[0xf].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x10].groupName = "exp";
    init::functionCaseGroups[0x10].func = "exp";
    init::functionCaseGroups[0x10].types[0] = F;
    init::functionCaseGroups[0x10].types[1] = F;
    init::functionCaseGroups[0x10].types[2] = N;
    init::functionCaseGroups[0x10].types[3] = N;
    init::functionCaseGroups[0x10].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x10].modifyParamNdx = -1;
    init::functionCaseGroups[0x10].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x10].booleanCase = false;
    init::functionCaseGroups[0x10].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x11].groupName = "log";
    init::functionCaseGroups[0x11].func = "log";
    init::functionCaseGroups[0x11].types[0] = F;
    init::functionCaseGroups[0x11].types[1] = F;
    init::functionCaseGroups[0x11].types[2] = N;
    init::functionCaseGroups[0x11].types[3] = N;
    init::functionCaseGroups[0x11].attribute = (Vec4 *)(attrNegPos.m_data + 2);
    init::functionCaseGroups[0x11].modifyParamNdx = -1;
    init::functionCaseGroups[0x11].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x11].booleanCase = false;
    init::functionCaseGroups[0x11].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x12].groupName = "exp2";
    init::functionCaseGroups[0x12].func = "exp2";
    init::functionCaseGroups[0x12].types[0] = F;
    init::functionCaseGroups[0x12].types[1] = F;
    init::functionCaseGroups[0x12].types[2] = N;
    init::functionCaseGroups[0x12].types[3] = N;
    init::functionCaseGroups[0x12].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x12].modifyParamNdx = -1;
    init::functionCaseGroups[0x12].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x12].booleanCase = false;
    init::functionCaseGroups[0x12].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x13].groupName = "log2";
    init::functionCaseGroups[0x13].func = "log2";
    init::functionCaseGroups[0x13].types[0] = F;
    init::functionCaseGroups[0x13].types[1] = F;
    init::functionCaseGroups[0x13].types[2] = N;
    init::functionCaseGroups[0x13].types[3] = N;
    init::functionCaseGroups[0x13].attribute = (Vec4 *)(attrNegPos.m_data + 2);
    init::functionCaseGroups[0x13].modifyParamNdx = -1;
    init::functionCaseGroups[0x13].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x13].booleanCase = false;
    init::functionCaseGroups[0x13].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x14].groupName = "sqrt";
    init::functionCaseGroups[0x14].func = "sqrt";
    init::functionCaseGroups[0x14].types[0] = F;
    init::functionCaseGroups[0x14].types[1] = F;
    init::functionCaseGroups[0x14].types[2] = N;
    init::functionCaseGroups[0x14].types[3] = N;
    init::functionCaseGroups[0x14].attribute = (Vec4 *)(attrNegPos.m_data + 2);
    init::functionCaseGroups[0x14].modifyParamNdx = -1;
    init::functionCaseGroups[0x14].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x14].booleanCase = false;
    init::functionCaseGroups[0x14].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x15].groupName = "inversesqrt";
    init::functionCaseGroups[0x15].func = "inversesqrt";
    init::functionCaseGroups[0x15].types[0] = F;
    init::functionCaseGroups[0x15].types[1] = F;
    init::functionCaseGroups[0x15].types[2] = N;
    init::functionCaseGroups[0x15].types[3] = N;
    init::functionCaseGroups[0x15].attribute = (Vec4 *)(attrNegPos.m_data + 2);
    init::functionCaseGroups[0x15].modifyParamNdx = -1;
    init::functionCaseGroups[0x15].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x15].booleanCase = false;
    init::functionCaseGroups[0x15].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x16].groupName = "abs";
    init::functionCaseGroups[0x16].func = "abs";
    init::functionCaseGroups[0x16].types[0] = F;
    init::functionCaseGroups[0x16].types[1] = F;
    init::functionCaseGroups[0x16].types[2] = N;
    init::functionCaseGroups[0x16].types[3] = N;
    init::functionCaseGroups[0x16].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x16].modifyParamNdx = -1;
    init::functionCaseGroups[0x16].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x16].booleanCase = false;
    init::functionCaseGroups[0x16].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x17].groupName = "abs";
    init::functionCaseGroups[0x17].func = "abs";
    init::functionCaseGroups[0x17].types[0] = V4;
    init::functionCaseGroups[0x17].types[1] = V4;
    init::functionCaseGroups[0x17].types[2] = N;
    init::functionCaseGroups[0x17].types[3] = N;
    init::functionCaseGroups[0x17].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x17].modifyParamNdx = -1;
    init::functionCaseGroups[0x17].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x17].booleanCase = false;
    init::functionCaseGroups[0x17].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x18].groupName = "sign";
    init::functionCaseGroups[0x18].func = "sign";
    init::functionCaseGroups[0x18].types[0] = F;
    init::functionCaseGroups[0x18].types[1] = F;
    init::functionCaseGroups[0x18].types[2] = N;
    init::functionCaseGroups[0x18].types[3] = N;
    init::functionCaseGroups[0x18].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x18].modifyParamNdx = -1;
    init::functionCaseGroups[0x18].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x18].booleanCase = false;
    init::functionCaseGroups[0x18].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x19].groupName = "sign";
    init::functionCaseGroups[0x19].func = "sign";
    init::functionCaseGroups[0x19].types[0] = V4;
    init::functionCaseGroups[0x19].types[1] = V4;
    init::functionCaseGroups[0x19].types[2] = N;
    init::functionCaseGroups[0x19].types[3] = N;
    init::functionCaseGroups[0x19].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x19].modifyParamNdx = -1;
    init::functionCaseGroups[0x19].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x19].booleanCase = false;
    init::functionCaseGroups[0x19].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1a].groupName = "floor";
    init::functionCaseGroups[0x1a].func = "floor";
    init::functionCaseGroups[0x1a].types[0] = F;
    init::functionCaseGroups[0x1a].types[1] = F;
    init::functionCaseGroups[0x1a].types[2] = N;
    init::functionCaseGroups[0x1a].types[3] = N;
    init::functionCaseGroups[0x1a].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1a].modifyParamNdx = -1;
    init::functionCaseGroups[0x1a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1a].booleanCase = false;
    init::functionCaseGroups[0x1a].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1b].groupName = "floor";
    init::functionCaseGroups[0x1b].func = "floor";
    init::functionCaseGroups[0x1b].types[0] = V4;
    init::functionCaseGroups[0x1b].types[1] = V4;
    init::functionCaseGroups[0x1b].types[2] = N;
    init::functionCaseGroups[0x1b].types[3] = N;
    init::functionCaseGroups[0x1b].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1b].modifyParamNdx = -1;
    init::functionCaseGroups[0x1b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1b].booleanCase = false;
    init::functionCaseGroups[0x1b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1c].groupName = "trunc";
    init::functionCaseGroups[0x1c].func = "trunc";
    init::functionCaseGroups[0x1c].types[0] = F;
    init::functionCaseGroups[0x1c].types[1] = F;
    init::functionCaseGroups[0x1c].types[2] = N;
    init::functionCaseGroups[0x1c].types[3] = N;
    init::functionCaseGroups[0x1c].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1c].modifyParamNdx = -1;
    init::functionCaseGroups[0x1c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1c].booleanCase = false;
    init::functionCaseGroups[0x1c].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1d].groupName = "trunc";
    init::functionCaseGroups[0x1d].func = "trunc";
    init::functionCaseGroups[0x1d].types[0] = V4;
    init::functionCaseGroups[0x1d].types[1] = V4;
    init::functionCaseGroups[0x1d].types[2] = N;
    init::functionCaseGroups[0x1d].types[3] = N;
    init::functionCaseGroups[0x1d].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1d].modifyParamNdx = -1;
    init::functionCaseGroups[0x1d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1d].booleanCase = false;
    init::functionCaseGroups[0x1d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x1e].groupName = "round";
    init::functionCaseGroups[0x1e].func = "round";
    init::functionCaseGroups[0x1e].types[0] = F;
    init::functionCaseGroups[0x1e].types[1] = F;
    init::functionCaseGroups[0x1e].types[2] = N;
    init::functionCaseGroups[0x1e].types[3] = N;
    init::functionCaseGroups[0x1e].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1e].modifyParamNdx = -1;
    init::functionCaseGroups[0x1e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1e].booleanCase = false;
    init::functionCaseGroups[0x1e].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x1f].groupName = "round";
    init::functionCaseGroups[0x1f].func = "round";
    init::functionCaseGroups[0x1f].types[0] = V4;
    init::functionCaseGroups[0x1f].types[1] = V4;
    init::functionCaseGroups[0x1f].types[2] = N;
    init::functionCaseGroups[0x1f].types[3] = N;
    init::functionCaseGroups[0x1f].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x1f].modifyParamNdx = -1;
    init::functionCaseGroups[0x1f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x1f].booleanCase = false;
    init::functionCaseGroups[0x1f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x20].groupName = "roundEven";
    init::functionCaseGroups[0x20].func = "roundEven";
    init::functionCaseGroups[0x20].types[0] = F;
    init::functionCaseGroups[0x20].types[1] = F;
    init::functionCaseGroups[0x20].types[2] = N;
    init::functionCaseGroups[0x20].types[3] = N;
    init::functionCaseGroups[0x20].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x20].modifyParamNdx = -1;
    init::functionCaseGroups[0x20].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x20].booleanCase = false;
    init::functionCaseGroups[0x20].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x21].groupName = "roundEven";
    init::functionCaseGroups[0x21].func = "roundEven";
    init::functionCaseGroups[0x21].types[0] = V4;
    init::functionCaseGroups[0x21].types[1] = V4;
    init::functionCaseGroups[0x21].types[2] = N;
    init::functionCaseGroups[0x21].types[3] = N;
    init::functionCaseGroups[0x21].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x21].modifyParamNdx = -1;
    init::functionCaseGroups[0x21].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x21].booleanCase = false;
    init::functionCaseGroups[0x21].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x22].groupName = "ceil";
    init::functionCaseGroups[0x22].func = "ceil";
    init::functionCaseGroups[0x22].types[0] = F;
    init::functionCaseGroups[0x22].types[1] = F;
    init::functionCaseGroups[0x22].types[2] = N;
    init::functionCaseGroups[0x22].types[3] = N;
    init::functionCaseGroups[0x22].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x22].modifyParamNdx = -1;
    init::functionCaseGroups[0x22].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x22].booleanCase = false;
    init::functionCaseGroups[0x22].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x23].groupName = "ceil";
    init::functionCaseGroups[0x23].func = "ceil";
    init::functionCaseGroups[0x23].types[0] = V4;
    init::functionCaseGroups[0x23].types[1] = V4;
    init::functionCaseGroups[0x23].types[2] = N;
    init::functionCaseGroups[0x23].types[3] = N;
    init::functionCaseGroups[0x23].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x23].modifyParamNdx = -1;
    init::functionCaseGroups[0x23].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x23].booleanCase = false;
    init::functionCaseGroups[0x23].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x24].groupName = "fract";
    init::functionCaseGroups[0x24].func = "fract";
    init::functionCaseGroups[0x24].types[0] = F;
    init::functionCaseGroups[0x24].types[1] = F;
    init::functionCaseGroups[0x24].types[2] = N;
    init::functionCaseGroups[0x24].types[3] = N;
    init::functionCaseGroups[0x24].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x24].modifyParamNdx = -1;
    init::functionCaseGroups[0x24].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x24].booleanCase = false;
    init::functionCaseGroups[0x24].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x25].groupName = "fract";
    init::functionCaseGroups[0x25].func = "fract";
    init::functionCaseGroups[0x25].types[0] = V4;
    init::functionCaseGroups[0x25].types[1] = V4;
    init::functionCaseGroups[0x25].types[2] = N;
    init::functionCaseGroups[0x25].types[3] = N;
    init::functionCaseGroups[0x25].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x25].modifyParamNdx = -1;
    init::functionCaseGroups[0x25].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x25].booleanCase = false;
    init::functionCaseGroups[0x25].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x26].groupName = "mod";
    init::functionCaseGroups[0x26].func = "mod";
    init::functionCaseGroups[0x26].types[0] = GT;
    init::functionCaseGroups[0x26].types[1] = GT;
    init::functionCaseGroups[0x26].types[2] = GT;
    init::functionCaseGroups[0x26].types[3] = N;
    init::functionCaseGroups[0x26].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x26].modifyParamNdx = -1;
    init::functionCaseGroups[0x26].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x26].booleanCase = false;
    init::functionCaseGroups[0x26].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x27].groupName = "min";
    init::functionCaseGroups[0x27].func = "min";
    init::functionCaseGroups[0x27].types[0] = F;
    init::functionCaseGroups[0x27].types[1] = F;
    init::functionCaseGroups[0x27].types[2] = F;
    init::functionCaseGroups[0x27].types[3] = N;
    init::functionCaseGroups[0x27].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x27].modifyParamNdx = -1;
    init::functionCaseGroups[0x27].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x27].booleanCase = false;
    init::functionCaseGroups[0x27].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x28].groupName = "min";
    init::functionCaseGroups[0x28].func = "min";
    init::functionCaseGroups[0x28].types[0] = V4;
    init::functionCaseGroups[0x28].types[1] = V4;
    init::functionCaseGroups[0x28].types[2] = V4;
    init::functionCaseGroups[0x28].types[3] = N;
    init::functionCaseGroups[0x28].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x28].modifyParamNdx = -1;
    init::functionCaseGroups[0x28].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x28].booleanCase = false;
    init::functionCaseGroups[0x28].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x29].groupName = "max";
    init::functionCaseGroups[0x29].func = "max";
    init::functionCaseGroups[0x29].types[0] = F;
    init::functionCaseGroups[0x29].types[1] = F;
    init::functionCaseGroups[0x29].types[2] = F;
    init::functionCaseGroups[0x29].types[3] = N;
    init::functionCaseGroups[0x29].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x29].modifyParamNdx = -1;
    init::functionCaseGroups[0x29].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x29].booleanCase = false;
    init::functionCaseGroups[0x29].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2a].groupName = "max";
    init::functionCaseGroups[0x2a].func = "max";
    init::functionCaseGroups[0x2a].types[0] = V4;
    init::functionCaseGroups[0x2a].types[1] = V4;
    init::functionCaseGroups[0x2a].types[2] = V4;
    init::functionCaseGroups[0x2a].types[3] = N;
    init::functionCaseGroups[0x2a].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x2a].modifyParamNdx = -1;
    init::functionCaseGroups[0x2a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2a].booleanCase = false;
    init::functionCaseGroups[0x2a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2b].groupName = "clamp";
    init::functionCaseGroups[0x2b].func = "clamp";
    init::functionCaseGroups[0x2b].types[0] = F;
    init::functionCaseGroups[0x2b].types[1] = F;
    init::functionCaseGroups[0x2b].types[2] = F;
    init::functionCaseGroups[0x2b].types[3] = F;
    init::functionCaseGroups[0x2b].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[0x2b].modifyParamNdx = 2;
    init::functionCaseGroups[0x2b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2b].booleanCase = false;
    init::functionCaseGroups[0x2b].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2c].groupName = "clamp";
    init::functionCaseGroups[0x2c].func = "clamp";
    init::functionCaseGroups[0x2c].types[0] = V4;
    init::functionCaseGroups[0x2c].types[1] = V4;
    init::functionCaseGroups[0x2c].types[2] = V4;
    init::functionCaseGroups[0x2c].types[3] = V4;
    init::functionCaseGroups[0x2c].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[0x2c].modifyParamNdx = 2;
    init::functionCaseGroups[0x2c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2c].booleanCase = false;
    init::functionCaseGroups[0x2c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2d].groupName = "mix";
    init::functionCaseGroups[0x2d].func = "mix";
    init::functionCaseGroups[0x2d].types[0] = F;
    init::functionCaseGroups[0x2d].types[1] = F;
    init::functionCaseGroups[0x2d].types[2] = F;
    init::functionCaseGroups[0x2d].types[3] = F;
    init::functionCaseGroups[0x2d].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x2d].modifyParamNdx = -1;
    init::functionCaseGroups[0x2d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2d].booleanCase = false;
    init::functionCaseGroups[0x2d].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x2e].groupName = "mix";
    init::functionCaseGroups[0x2e].func = "mix";
    init::functionCaseGroups[0x2e].types[0] = V4;
    init::functionCaseGroups[0x2e].types[1] = V4;
    init::functionCaseGroups[0x2e].types[2] = V4;
    init::functionCaseGroups[0x2e].types[3] = V4;
    init::functionCaseGroups[0x2e].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x2e].modifyParamNdx = -1;
    init::functionCaseGroups[0x2e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2e].booleanCase = false;
    init::functionCaseGroups[0x2e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x2f].groupName = "mix";
    init::functionCaseGroups[0x2f].func = "mix";
    init::functionCaseGroups[0x2f].types[0] = F;
    init::functionCaseGroups[0x2f].types[1] = F;
    init::functionCaseGroups[0x2f].types[2] = F;
    init::functionCaseGroups[0x2f].types[3] = B;
    init::functionCaseGroups[0x2f].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x2f].modifyParamNdx = -1;
    init::functionCaseGroups[0x2f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x2f].booleanCase = false;
    init::functionCaseGroups[0x2f].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x30].groupName = "mix";
    init::functionCaseGroups[0x30].func = "mix";
    init::functionCaseGroups[0x30].types[0] = V4;
    init::functionCaseGroups[0x30].types[1] = V4;
    init::functionCaseGroups[0x30].types[2] = V4;
    init::functionCaseGroups[0x30].types[3] = B4;
    init::functionCaseGroups[0x30].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x30].modifyParamNdx = -1;
    init::functionCaseGroups[0x30].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x30].booleanCase = false;
    init::functionCaseGroups[0x30].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x31].groupName = "step";
    init::functionCaseGroups[0x31].func = "step";
    init::functionCaseGroups[0x31].types[0] = F;
    init::functionCaseGroups[0x31].types[1] = F;
    init::functionCaseGroups[0x31].types[2] = F;
    init::functionCaseGroups[0x31].types[3] = N;
    init::functionCaseGroups[0x31].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x31].modifyParamNdx = -1;
    init::functionCaseGroups[0x31].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x31].booleanCase = false;
    init::functionCaseGroups[0x31].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x32].groupName = "step";
    init::functionCaseGroups[0x32].func = "step";
    init::functionCaseGroups[0x32].types[0] = V4;
    init::functionCaseGroups[0x32].types[1] = V4;
    init::functionCaseGroups[0x32].types[2] = V4;
    init::functionCaseGroups[0x32].types[3] = N;
    init::functionCaseGroups[0x32].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x32].modifyParamNdx = -1;
    init::functionCaseGroups[0x32].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x32].booleanCase = false;
    init::functionCaseGroups[0x32].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x33].groupName = "smoothstep";
    init::functionCaseGroups[0x33].func = "smoothstep";
    init::functionCaseGroups[0x33].types[0] = F;
    init::functionCaseGroups[0x33].types[1] = F;
    init::functionCaseGroups[0x33].types[2] = F;
    init::functionCaseGroups[0x33].types[3] = F;
    init::functionCaseGroups[0x33].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[0x33].modifyParamNdx = 1;
    init::functionCaseGroups[0x33].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x33].booleanCase = false;
    init::functionCaseGroups[0x33].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x34].groupName = "smoothstep";
    init::functionCaseGroups[0x34].func = "smoothstep";
    init::functionCaseGroups[0x34].types[0] = V4;
    init::functionCaseGroups[0x34].types[1] = V4;
    init::functionCaseGroups[0x34].types[2] = V4;
    init::functionCaseGroups[0x34].types[3] = V4;
    init::functionCaseGroups[0x34].attribute = (Vec4 *)(attrBig.m_data + 2);
    init::functionCaseGroups[0x34].modifyParamNdx = 1;
    init::functionCaseGroups[0x34].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x34].booleanCase = false;
    init::functionCaseGroups[0x34].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x35].groupName = "isnan";
    init::functionCaseGroups[0x35].func = "isnan";
    init::functionCaseGroups[0x35].types[0] = B;
    init::functionCaseGroups[0x35].types[1] = F;
    init::functionCaseGroups[0x35].types[2] = N;
    init::functionCaseGroups[0x35].types[3] = N;
    init::functionCaseGroups[0x35].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x35].modifyParamNdx = -1;
    init::functionCaseGroups[0x35].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x35].booleanCase = false;
    init::functionCaseGroups[0x35].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x36].groupName = "isnan";
    init::functionCaseGroups[0x36].func = "isnan";
    init::functionCaseGroups[0x36].types[0] = B4;
    init::functionCaseGroups[0x36].types[1] = V4;
    init::functionCaseGroups[0x36].types[2] = N;
    init::functionCaseGroups[0x36].types[3] = N;
    init::functionCaseGroups[0x36].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x36].modifyParamNdx = -1;
    init::functionCaseGroups[0x36].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x36].booleanCase = false;
    init::functionCaseGroups[0x36].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x37].groupName = "isinf";
    init::functionCaseGroups[0x37].func = "isinf";
    init::functionCaseGroups[0x37].types[0] = B;
    init::functionCaseGroups[0x37].types[1] = F;
    init::functionCaseGroups[0x37].types[2] = N;
    init::functionCaseGroups[0x37].types[3] = N;
    init::functionCaseGroups[0x37].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x37].modifyParamNdx = -1;
    init::functionCaseGroups[0x37].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x37].booleanCase = false;
    init::functionCaseGroups[0x37].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x38].groupName = "isinf";
    init::functionCaseGroups[0x38].func = "isinf";
    init::functionCaseGroups[0x38].types[0] = B4;
    init::functionCaseGroups[0x38].types[1] = V4;
    init::functionCaseGroups[0x38].types[2] = N;
    init::functionCaseGroups[0x38].types[3] = N;
    init::functionCaseGroups[0x38].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x38].modifyParamNdx = -1;
    init::functionCaseGroups[0x38].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x38].booleanCase = false;
    init::functionCaseGroups[0x38].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x39].groupName = "floatBitsToInt";
    init::functionCaseGroups[0x39].func = "floatBitsToInt";
    init::functionCaseGroups[0x39].types[0] = I;
    init::functionCaseGroups[0x39].types[1] = F;
    init::functionCaseGroups[0x39].types[2] = N;
    init::functionCaseGroups[0x39].types[3] = N;
    init::functionCaseGroups[0x39].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x39].modifyParamNdx = -1;
    init::functionCaseGroups[0x39].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x39].booleanCase = false;
    init::functionCaseGroups[0x39].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x3a].groupName = "floatBitsToInt";
    init::functionCaseGroups[0x3a].func = "floatBitsToInt";
    init::functionCaseGroups[0x3a].types[0] = I4;
    init::functionCaseGroups[0x3a].types[1] = V4;
    init::functionCaseGroups[0x3a].types[2] = N;
    init::functionCaseGroups[0x3a].types[3] = N;
    init::functionCaseGroups[0x3a].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3a].modifyParamNdx = -1;
    init::functionCaseGroups[0x3a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3a].booleanCase = false;
    init::functionCaseGroups[0x3a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3b].groupName = "intBitsToFloat";
    init::functionCaseGroups[0x3b].func = "intBitsToFloat";
    init::functionCaseGroups[0x3b].types[0] = F;
    init::functionCaseGroups[0x3b].types[1] = I;
    init::functionCaseGroups[0x3b].types[2] = N;
    init::functionCaseGroups[0x3b].types[3] = N;
    init::functionCaseGroups[0x3b].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3b].modifyParamNdx = -1;
    init::functionCaseGroups[0x3b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3b].booleanCase = false;
    init::functionCaseGroups[0x3b].precMask = PRECMASK_MEDIUMP_HIGHP;
    init::functionCaseGroups[0x3c].groupName = "intBitsToFloat";
    init::functionCaseGroups[0x3c].func = "intBitsToFloat";
    init::functionCaseGroups[0x3c].types[0] = V4;
    init::functionCaseGroups[0x3c].types[1] = I4;
    init::functionCaseGroups[0x3c].types[2] = N;
    init::functionCaseGroups[0x3c].types[3] = N;
    init::functionCaseGroups[0x3c].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3c].modifyParamNdx = -1;
    init::functionCaseGroups[0x3c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3c].booleanCase = false;
    init::functionCaseGroups[0x3c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3d].groupName = "length";
    init::functionCaseGroups[0x3d].func = "length";
    init::functionCaseGroups[0x3d].types[0] = F;
    init::functionCaseGroups[0x3d].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3d].types[2] = N;
    init::functionCaseGroups[0x3d].types[3] = N;
    init::functionCaseGroups[0x3d].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3d].modifyParamNdx = -1;
    init::functionCaseGroups[0x3d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3d].booleanCase = false;
    init::functionCaseGroups[0x3d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3e].groupName = "distance";
    init::functionCaseGroups[0x3e].func = "distance";
    init::functionCaseGroups[0x3e].types[0] = F;
    init::functionCaseGroups[0x3e].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3e].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3e].types[3] = N;
    init::functionCaseGroups[0x3e].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3e].modifyParamNdx = -1;
    init::functionCaseGroups[0x3e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3e].booleanCase = false;
    init::functionCaseGroups[0x3e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x3f].groupName = "dot";
    init::functionCaseGroups[0x3f].func = "dot";
    init::functionCaseGroups[0x3f].types[0] = F;
    init::functionCaseGroups[0x3f].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3f].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x3f].types[3] = N;
    init::functionCaseGroups[0x3f].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x3f].modifyParamNdx = -1;
    init::functionCaseGroups[0x3f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x3f].booleanCase = false;
    init::functionCaseGroups[0x3f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x40].groupName = "cross";
    init::functionCaseGroups[0x40].func = "cross";
    init::functionCaseGroups[0x40].types[0] = V3;
    init::functionCaseGroups[0x40].types[1] = V3;
    init::functionCaseGroups[0x40].types[2] = V3;
    init::functionCaseGroups[0x40].types[3] = N;
    init::functionCaseGroups[0x40].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x40].modifyParamNdx = -1;
    init::functionCaseGroups[0x40].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x40].booleanCase = false;
    init::functionCaseGroups[0x40].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x41].groupName = "normalize";
    init::functionCaseGroups[0x41].func = "normalize";
    init::functionCaseGroups[0x41].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x41].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x41].types[2] = N;
    init::functionCaseGroups[0x41].types[3] = N;
    init::functionCaseGroups[0x41].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x41].modifyParamNdx = -1;
    init::functionCaseGroups[0x41].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x41].booleanCase = false;
    init::functionCaseGroups[0x41].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x42].groupName = "faceforward";
    init::functionCaseGroups[0x42].func = "faceforward";
    init::functionCaseGroups[0x42].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].types[3] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x42].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x42].modifyParamNdx = -1;
    init::functionCaseGroups[0x42].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x42].booleanCase = false;
    init::functionCaseGroups[0x42].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x43].groupName = "reflect";
    init::functionCaseGroups[0x43].func = "reflect";
    init::functionCaseGroups[0x43].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x43].types[3] = N;
    init::functionCaseGroups[0x43].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x43].modifyParamNdx = -1;
    init::functionCaseGroups[0x43].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x43].booleanCase = false;
    init::functionCaseGroups[0x43].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x44].groupName = "refract";
    init::functionCaseGroups[0x44].func = "refract";
    init::functionCaseGroups[0x44].types[0] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[1] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[2] = VALUE_FLOAT_VEC34;
    init::functionCaseGroups[0x44].types[3] = F;
    init::functionCaseGroups[0x44].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x44].modifyParamNdx = -1;
    init::functionCaseGroups[0x44].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x44].booleanCase = false;
    init::functionCaseGroups[0x44].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x45].groupName = "matrixCompMult";
    init::functionCaseGroups[0x45].func = "matrixCompMult";
    init::functionCaseGroups[0x45].types[0] = M;
    init::functionCaseGroups[0x45].types[1] = M;
    init::functionCaseGroups[0x45].types[2] = M;
    init::functionCaseGroups[0x45].types[3] = N;
    init::functionCaseGroups[0x45].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x45].modifyParamNdx = -1;
    init::functionCaseGroups[0x45].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x45].booleanCase = false;
    init::functionCaseGroups[0x45].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x46].groupName = "transpose";
    init::functionCaseGroups[0x46].func = "transpose";
    init::functionCaseGroups[0x46].types[0] = M;
    init::functionCaseGroups[0x46].types[1] = M;
    init::functionCaseGroups[0x46].types[2] = N;
    init::functionCaseGroups[0x46].types[3] = N;
    init::functionCaseGroups[0x46].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x46].modifyParamNdx = -1;
    init::functionCaseGroups[0x46].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x46].booleanCase = false;
    init::functionCaseGroups[0x46].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x47].groupName = "inverse";
    init::functionCaseGroups[0x47].func = "inverse";
    init::functionCaseGroups[0x47].types[0] = M;
    init::functionCaseGroups[0x47].types[1] = M;
    init::functionCaseGroups[0x47].types[2] = N;
    init::functionCaseGroups[0x47].types[3] = N;
    init::functionCaseGroups[0x47].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x47].modifyParamNdx = -1;
    init::functionCaseGroups[0x47].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x47].booleanCase = false;
    init::functionCaseGroups[0x47].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x48].groupName = "lessThan";
    init::functionCaseGroups[0x48].func = "lessThan";
    init::functionCaseGroups[0x48].types[0] = BV;
    init::functionCaseGroups[0x48].types[1] = FV;
    init::functionCaseGroups[0x48].types[2] = FV;
    init::functionCaseGroups[0x48].types[3] = N;
    init::functionCaseGroups[0x48].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x48].modifyParamNdx = -1;
    init::functionCaseGroups[0x48].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x48].booleanCase = false;
    init::functionCaseGroups[0x48].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x49].groupName = "lessThanEqual";
    init::functionCaseGroups[0x49].func = "lessThanEqual";
    init::functionCaseGroups[0x49].types[0] = BV;
    init::functionCaseGroups[0x49].types[1] = FV;
    init::functionCaseGroups[0x49].types[2] = FV;
    init::functionCaseGroups[0x49].types[3] = N;
    init::functionCaseGroups[0x49].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x49].modifyParamNdx = -1;
    init::functionCaseGroups[0x49].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x49].booleanCase = false;
    init::functionCaseGroups[0x49].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4a].groupName = "greaterThan";
    init::functionCaseGroups[0x4a].func = "greaterThan";
    init::functionCaseGroups[0x4a].types[0] = BV;
    init::functionCaseGroups[0x4a].types[1] = FV;
    init::functionCaseGroups[0x4a].types[2] = FV;
    init::functionCaseGroups[0x4a].types[3] = N;
    init::functionCaseGroups[0x4a].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4a].modifyParamNdx = -1;
    init::functionCaseGroups[0x4a].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4a].booleanCase = false;
    init::functionCaseGroups[0x4a].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4b].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x4b].func = "greaterThanEqual";
    init::functionCaseGroups[0x4b].types[0] = BV;
    init::functionCaseGroups[0x4b].types[1] = FV;
    init::functionCaseGroups[0x4b].types[2] = FV;
    init::functionCaseGroups[0x4b].types[3] = N;
    init::functionCaseGroups[0x4b].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4b].modifyParamNdx = -1;
    init::functionCaseGroups[0x4b].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4b].booleanCase = false;
    init::functionCaseGroups[0x4b].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4c].groupName = "equal";
    init::functionCaseGroups[0x4c].func = "equal";
    init::functionCaseGroups[0x4c].types[0] = BV;
    init::functionCaseGroups[0x4c].types[1] = FV;
    init::functionCaseGroups[0x4c].types[2] = FV;
    init::functionCaseGroups[0x4c].types[3] = N;
    init::functionCaseGroups[0x4c].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4c].modifyParamNdx = -1;
    init::functionCaseGroups[0x4c].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4c].booleanCase = false;
    init::functionCaseGroups[0x4c].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4d].groupName = "notEqual";
    init::functionCaseGroups[0x4d].func = "notEqual";
    init::functionCaseGroups[0x4d].types[0] = BV;
    init::functionCaseGroups[0x4d].types[1] = FV;
    init::functionCaseGroups[0x4d].types[2] = FV;
    init::functionCaseGroups[0x4d].types[3] = N;
    init::functionCaseGroups[0x4d].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4d].modifyParamNdx = -1;
    init::functionCaseGroups[0x4d].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4d].booleanCase = false;
    init::functionCaseGroups[0x4d].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4e].groupName = "lessThan";
    init::functionCaseGroups[0x4e].func = "lessThan";
    init::functionCaseGroups[0x4e].types[0] = BV;
    init::functionCaseGroups[0x4e].types[1] = IV;
    init::functionCaseGroups[0x4e].types[2] = IV;
    init::functionCaseGroups[0x4e].types[3] = N;
    init::functionCaseGroups[0x4e].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4e].modifyParamNdx = -1;
    init::functionCaseGroups[0x4e].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4e].booleanCase = false;
    init::functionCaseGroups[0x4e].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x4f].groupName = "lessThanEqual";
    init::functionCaseGroups[0x4f].func = "lessThanEqual";
    init::functionCaseGroups[0x4f].types[0] = BV;
    init::functionCaseGroups[0x4f].types[1] = IV;
    init::functionCaseGroups[0x4f].types[2] = IV;
    init::functionCaseGroups[0x4f].types[3] = N;
    init::functionCaseGroups[0x4f].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x4f].modifyParamNdx = -1;
    init::functionCaseGroups[0x4f].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x4f].booleanCase = false;
    init::functionCaseGroups[0x4f].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x50].groupName = "greaterThan";
    init::functionCaseGroups[0x50].func = "greaterThan";
    init::functionCaseGroups[0x50].types[0] = BV;
    init::functionCaseGroups[0x50].types[1] = IV;
    init::functionCaseGroups[0x50].types[2] = IV;
    init::functionCaseGroups[0x50].types[3] = N;
    init::functionCaseGroups[0x50].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x50].modifyParamNdx = -1;
    init::functionCaseGroups[0x50].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x50].booleanCase = false;
    init::functionCaseGroups[0x50].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x51].groupName = "greaterThanEqual";
    init::functionCaseGroups[0x51].func = "greaterThanEqual";
    init::functionCaseGroups[0x51].types[0] = BV;
    init::functionCaseGroups[0x51].types[1] = IV;
    init::functionCaseGroups[0x51].types[2] = IV;
    init::functionCaseGroups[0x51].types[3] = N;
    init::functionCaseGroups[0x51].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x51].modifyParamNdx = -1;
    init::functionCaseGroups[0x51].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x51].booleanCase = false;
    init::functionCaseGroups[0x51].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x52].groupName = "equal";
    init::functionCaseGroups[0x52].func = "equal";
    init::functionCaseGroups[0x52].types[0] = BV;
    init::functionCaseGroups[0x52].types[1] = IV;
    init::functionCaseGroups[0x52].types[2] = IV;
    init::functionCaseGroups[0x52].types[3] = N;
    init::functionCaseGroups[0x52].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x52].modifyParamNdx = -1;
    init::functionCaseGroups[0x52].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x52].booleanCase = false;
    init::functionCaseGroups[0x52].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x53].groupName = "notEqual";
    init::functionCaseGroups[0x53].func = "notEqual";
    init::functionCaseGroups[0x53].types[0] = BV;
    init::functionCaseGroups[0x53].types[1] = IV;
    init::functionCaseGroups[0x53].types[2] = IV;
    init::functionCaseGroups[0x53].types[3] = N;
    init::functionCaseGroups[0x53].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x53].modifyParamNdx = -1;
    init::functionCaseGroups[0x53].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x53].booleanCase = false;
    init::functionCaseGroups[0x53].precMask = PRECMASK_ALL;
    init::functionCaseGroups[0x54].groupName = "equal";
    init::functionCaseGroups[0x54].func = "equal";
    init::functionCaseGroups[0x54].types[0] = BV;
    init::functionCaseGroups[0x54].types[1] = BV;
    init::functionCaseGroups[0x54].types[2] = BV;
    init::functionCaseGroups[0x54].types[3] = N;
    init::functionCaseGroups[0x54].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x54].modifyParamNdx = -1;
    init::functionCaseGroups[0x54].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x54].booleanCase = true;
    init::functionCaseGroups[0x54].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x55].groupName = "notEqual";
    init::functionCaseGroups[0x55].func = "notEqual";
    init::functionCaseGroups[0x55].types[0] = BV;
    init::functionCaseGroups[0x55].types[1] = BV;
    init::functionCaseGroups[0x55].types[2] = BV;
    init::functionCaseGroups[0x55].types[3] = N;
    init::functionCaseGroups[0x55].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x55].modifyParamNdx = -1;
    init::functionCaseGroups[0x55].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x55].booleanCase = true;
    init::functionCaseGroups[0x55].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x56].groupName = "any";
    init::functionCaseGroups[0x56].func = "any";
    init::functionCaseGroups[0x56].types[0] = B;
    init::functionCaseGroups[0x56].types[1] = BV;
    init::functionCaseGroups[0x56].types[2] = N;
    init::functionCaseGroups[0x56].types[3] = N;
    init::functionCaseGroups[0x56].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x56].modifyParamNdx = -1;
    init::functionCaseGroups[0x56].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x56].booleanCase = true;
    init::functionCaseGroups[0x56].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x57].groupName = "all";
    init::functionCaseGroups[0x57].func = "all";
    init::functionCaseGroups[0x57].types[0] = B;
    init::functionCaseGroups[0x57].types[1] = BV;
    init::functionCaseGroups[0x57].types[2] = N;
    init::functionCaseGroups[0x57].types[3] = N;
    init::functionCaseGroups[0x57].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x57].modifyParamNdx = -1;
    init::functionCaseGroups[0x57].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x57].booleanCase = true;
    init::functionCaseGroups[0x57].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0x58].groupName = "not";
    init::functionCaseGroups[0x58].func = "not";
    init::functionCaseGroups[0x58].types[0] = BV;
    init::functionCaseGroups[0x58].types[1] = BV;
    init::functionCaseGroups[0x58].types[2] = N;
    init::functionCaseGroups[0x58].types[3] = N;
    init::functionCaseGroups[0x58].attribute = (Vec4 *)(attrSmall.m_data + 2);
    init::functionCaseGroups[0x58].modifyParamNdx = -1;
    init::functionCaseGroups[0x58].useNearlyConstantInputs = false;
    init::functionCaseGroups[0x58].booleanCase = true;
    init::functionCaseGroups[0x58].precMask = PRECMASK_MEDIUMP;
    init::functionCaseGroups[0].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[1].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[2].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[3].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[4].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[5].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[6].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[7].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[8].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[9].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[10].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[0xb].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[0xc].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[0xd].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[0xe].parentGroup = (TestCaseGroup *)pTVar4;
    init::functionCaseGroups[0xf].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x10].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x11].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x12].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x13].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x14].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x15].parentGroup = (TestCaseGroup *)pTVar5;
    init::functionCaseGroups[0x16].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x17].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x18].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x19].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1a].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1b].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1c].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1d].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1e].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x1f].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x20].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x21].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x22].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x23].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x24].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x25].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x26].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x27].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x28].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x29].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2a].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2b].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2c].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2d].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2e].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x2f].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x30].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x31].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x32].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x33].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x34].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x35].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x36].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x37].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x38].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x39].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x3a].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x3b].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x3c].parentGroup = (TestCaseGroup *)pTVar7;
    init::functionCaseGroups[0x3d].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x3e].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x3f].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x40].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x41].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x42].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x43].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x44].parentGroup = (TestCaseGroup *)node;
    init::functionCaseGroups[0x45].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x46].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x47].parentGroup = (TestCaseGroup *)node_00;
    init::functionCaseGroups[0x48].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x49].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x4a].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x4b].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x4c].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x4d].parentGroup = (TestCaseGroup *)node_01;
    init::functionCaseGroups[0x4e].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x4f].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x50].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x51].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x52].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x53].parentGroup = (TestCaseGroup *)node_02;
    init::functionCaseGroups[0x54].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x55].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x56].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x57].parentGroup = (TestCaseGroup *)node_03;
    init::functionCaseGroups[0x58].parentGroup = (TestCaseGroup *)node_03;
    __cxa_guard_release(&init()::functionCaseGroups);
  }
  fragmentSubGroup = (TestCaseGroup *)0x0;
  vertexSubGroupCalibrationStorage.m_state = (SharedPtrStateBase *)0x0;
  de::
  SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  ::SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
               *)&fragmentSubGroupCalibrationStorage.m_state);
  de::
  SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  ::SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
               *)local_2e8);
  parentGroup._4_4_ = 0;
  do {
    if (0x58 < parentGroup._4_4_) {
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::~SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                    *)local_2e8);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::~SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                    *)&fragmentSubGroupCalibrationStorage.m_state);
      return extraout_EAX;
    }
    groupName = (char *)init::functionCaseGroups[parentGroup._4_4_].parentGroup;
    pcVar10 = init::functionCaseGroups[parentGroup._4_4_].groupName;
    groupFunc = pcVar10;
    funcTypes = (ValueType *)init::functionCaseGroups[parentGroup._4_4_].func;
    groupAttribute = (Vec4 *)init::functionCaseGroups[parentGroup._4_4_].types;
    pVStack_318 = init::functionCaseGroups[parentGroup._4_4_].attribute;
    precMask = init::functionCaseGroups[parentGroup._4_4_].modifyParamNdx;
    local_31d = init::functionCaseGroups[parentGroup._4_4_].useNearlyConstantInputs & 1;
    local_31e = init::functionCaseGroups[parentGroup._4_4_].booleanCase & 1;
    local_324 = init::functionCaseGroups[parentGroup._4_4_].precMask;
    funcGroup._6_1_ = 0;
    funcGroup._5_1_ = 0;
    local_671 = true;
    if ((parentGroup._4_4_ != 0) &&
       (local_671 = true,
       init::functionCaseGroups[parentGroup._4_4_].parentGroup ==
       init::functionCaseGroups[parentGroup._4_4_ + -1].parentGroup)) {
      std::allocator<char>::allocator();
      funcGroup._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,pcVar10,(allocator<char> *)((long)&funcGroup + 7));
      funcGroup._5_1_ = 1;
      local_671 = std::operator!=(&local_348,
                                  init::functionCaseGroups[parentGroup._4_4_ + -1].groupName);
    }
    if ((funcGroup._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_348);
    }
    if ((funcGroup._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&funcGroup + 7));
    }
    if (local_671 != false) {
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,groupFunc,
                 "");
      local_358 = pTVar4;
      tcu::TestNode::addChild
                (&(init::functionCaseGroups[parentGroup._4_4_].parentGroup)->super_TestNode,pTVar4);
      fragmentSubGroup = (TestCaseGroup *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                (fragmentSubGroup,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
                 "");
      vertexSubGroupCalibrationStorage.m_state = (SharedPtrStateBase *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)vertexSubGroupCalibrationStorage.m_state,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment"
                 ,"");
      tcu::TestNode::addChild(local_358,(TestNode *)fragmentSubGroup);
      tcu::TestNode::addChild(local_358,(TestNode *)vertexSubGroupCalibrationStorage.m_state);
      pIVar6 = (InitialCalibration *)operator_new(4);
      anon_unknown_1::OperatorPerformanceCase::InitialCalibration::InitialCalibration(pIVar6);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::SharedPtr(&local_368,pIVar6);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::operator=((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                   *)&fragmentSubGroupCalibrationStorage.m_state,&local_368);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::~SharedPtr(&local_368);
      pIVar6 = (InitialCalibration *)operator_new(4);
      anon_unknown_1::OperatorPerformanceCase::InitialCalibration::InitialCalibration(pIVar6);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                   *)&genTypeLastSize,pIVar6);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::operator=((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                   *)local_2e8,
                  (SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                   *)&genTypeLastSize);
      de::
      SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
      ::~SharedPtr((SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
                    *)&genTypeLastSize);
    }
    i = 1;
    curSize = 1;
    for (types[3] = TYPE_INVALID; (int)types[3] < 4 && curSize == 1;
        types[3] = types[3] + TYPE_FLOAT) {
      fVar1 = groupAttribute->m_data[(int)types[3]];
      if (fVar1 == 2.8026e-45) goto LAB_01f91b84;
      if (fVar1 == 5.60519e-45) {
        i = 3;
        curSize = 4;
      }
      else {
        if (fVar1 == 1.12104e-44) goto LAB_01f91bb0;
        if (fVar1 == 8.96831e-44) {
          i = 2;
          curSize = 4;
        }
        else if (fVar1 == 3.58732e-43) {
LAB_01f91b84:
          i = 2;
          curSize = 4;
        }
        else {
          if (fVar1 != 1.43493e-42) {
            if (fVar1 == 5.73972e-42) goto LAB_01f91b84;
            if (fVar1 != 2.29589e-41) goto LAB_01f91bde;
          }
LAB_01f91bb0:
          i = 1;
          curSize = 4;
        }
      }
LAB_01f91bde:
    }
    for (types[2] = i; (int)types[2] <= curSize; types[2] = types[2] + TYPE_FLOAT) {
      for (isBool = 0; isBool < 4; isBool = isBool + 1) {
        if (groupAttribute->m_data[isBool] == 0.0) {
          (&isFloat)[isBool] = 0;
        }
        else {
          bVar11 = groupAttribute->m_data[isBool] != 8.96831e-44;
          if (((uint)groupAttribute->m_data[isBool] & 0x554e) == 0) {
            if (groupAttribute->m_data[isBool] == 2.24208e-44) {
              local_6c8 = TYPE_FLOAT_VEC3;
            }
            else {
              if (groupAttribute->m_data[isBool] == 4.48416e-44) {
                local_6cc = TYPE_FLOAT_VEC4;
              }
              else {
                if (groupAttribute->m_data[isBool] == 7.17465e-43) {
                  local_6d0 = TYPE_FLOAT_VEC4;
                }
                else {
                  local_6d0 = TYPE_FLOAT;
                  if (groupAttribute->m_data[isBool] == 1.14794e-41) {
                    local_6d0 = TYPE_FLOAT_VEC4;
                  }
                }
                local_6cc = local_6d0;
              }
              local_6c8 = local_6cc;
            }
            local_6c4 = local_6c8;
          }
          else {
            local_6c4 = types[2];
          }
          paramTypes[2] = local_6c4;
          if (bVar11) {
            local_6d4 = local_6c4 - TYPE_FLOAT;
          }
          else {
            local_6d4 = local_6c4 - TYPE_FLOAT_VEC2;
          }
          paramTypes[1] = local_6d4;
          if (((uint)groupAttribute->m_data[isBool] & 0x3f) == 0) {
            if (((uint)groupAttribute->m_data[isBool] & 0x780) == 0) {
              if (((uint)groupAttribute->m_data[isBool] & 0x7800) == 0) {
                if (bVar11) {
                  local_6e4 = TYPE_LAST;
                }
                else {
                  local_6e4 = init::matrixTypes[(int)local_6d4];
                }
                local_6e0 = local_6e4;
              }
              else {
                local_6e0 = init::intTypes[(int)local_6d4];
              }
              local_6dc = local_6e0;
            }
            else {
              local_6dc = init::boolTypes[(int)local_6d4];
            }
            local_6d8 = local_6dc;
          }
          else {
            local_6d8 = init::floatTypes[(int)local_6d4];
          }
          (&isFloat)[isBool] = local_6d8;
        }
      }
      for (precisionPrefix.field_2._12_4_ = 0; (int)precisionPrefix.field_2._12_4_ < 3;
          precisionPrefix.field_2._12_4_ = precisionPrefix.field_2._12_4_ + 1) {
        (&prec)[(int)precisionPrefix.field_2._12_4_] =
             (&isFloat)[precisionPrefix.field_2._12_4_ + 1];
      }
      for (precisionPrefix.field_2._8_4_ = 0; (int)precisionPrefix.field_2._8_4_ < 3;
          precisionPrefix.field_2._8_4_ = precisionPrefix.field_2._8_4_ + 1) {
        if ((local_324 & 1 << ((byte)precisionPrefix.field_2._8_4_ & 0x1f)) != PRECMASK_NA) {
          local_3ea = 0;
          caseName._374_1_ = 0;
          caseName._373_1_ = 0;
          if ((local_31e & 1) == 0) {
            pcVar10 = glu::getPrecisionName(precisionPrefix.field_2._8_4_);
            std::allocator<char>::allocator();
            caseName._374_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_410,pcVar10,(allocator<char> *)&caseName.field_0x177);
            caseName._373_1_ = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3e8,&local_410,"_");
          }
          else {
            std::allocator<char>::allocator();
            local_3ea = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)local_3e8,"",&local_3e9);
          }
          if ((caseName._373_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_410);
          }
          if ((caseName._374_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&caseName.field_0x177);
          }
          if ((local_3ea & 1) != 0) {
            std::allocator<char>::~allocator(&local_3e9);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragI);
          std::operator<<((ostream *)&fragI,(string *)local_3e8);
          iStack_594 = 1;
          while( true ) {
            bVar11 = false;
            if (iStack_594 < 4) {
              bVar11 = (&isFloat)[iStack_594] != 0;
            }
            if (!bVar11) break;
            if ((iStack_594 == 1) || ((&isFloat)[iStack_594] != (&isFloat)[iStack_594 + -1])) {
              if (1 < iStack_594) {
                std::operator<<((ostream *)&fragI,"_");
              }
              pcVar10 = glu::getDataTypeName((&isFloat)[iStack_594]);
              std::operator<<((ostream *)&fragI,pcVar10);
            }
            iStack_594 = iStack_594 + 1;
          }
          for (local_598 = 0; local_598 < 2; local_598 = local_598 + 1) {
            group._7_1_ = local_598 == 0;
            if ((bool)group._7_1_) {
              local_718 = &fragmentSubGroup->super_TestNode;
            }
            else {
              local_718 = (TestNode *)vertexSubGroupCalibrationStorage.m_state;
            }
            local_5a8 = local_718;
            this_01 = (FunctionCase *)operator_new(0x1f8);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            if ((group._7_1_ & 1) == 0) {
              local_770 = (InitialCalibrationStorage *)local_2e8;
            }
            else {
              local_770 = (InitialCalibrationStorage *)&fragmentSubGroupCalibrationStorage.m_state;
            }
            anon_unknown_1::FunctionCase::FunctionCase
                      (this_01,pCVar2,pcVar10,"",(char *)funcTypes,isFloat,(DataType *)&prec,
                       pVStack_318,precMask,(bool)(local_31d & 1),precisionPrefix.field_2._8_4_,
                       (bool)(group._7_1_ & 1),local_770);
            tcu::TestNode::addChild(local_718,(TestNode *)this_01);
            std::__cxx11::string::~string(local_5c8);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragI);
          std::__cxx11::string::~string((string *)local_3e8);
        }
      }
    }
    parentGroup._4_4_ = parentGroup._4_4_ + 1;
  } while( true );
}

Assistant:

void ShaderOperatorTests::init (void)
{
	// Binary operator cases

	static const DataType binaryOpTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4,
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4,
	};
	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};
	static const struct
	{
		const char*		name;
		const char*		op;
		bool			swizzle;
	} binaryOps[] =
	{
		{ "add",		"+",		false	},
		{ "sub",		"-",		true	},
		{ "mul",		"*",		false	},
		{ "div",		"/",		true	}
	};

	tcu::TestCaseGroup* const binaryOpsGroup = new tcu::TestCaseGroup(m_testCtx, "binary_operator", "Binary Operator Performance Tests");
	addChild(binaryOpsGroup);

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(binaryOps); opNdx++)
	{
		tcu::TestCaseGroup* const opGroup = new tcu::TestCaseGroup(m_testCtx, binaryOps[opNdx].name, "");
		binaryOpsGroup->addChild(opGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			const BinaryOpCase::InitialCalibrationStorage	shaderGroupCalibrationStorage	(new BinaryOpCase::InitialCalibration);
			const bool										isVertex						= isFrag == 0;
			tcu::TestCaseGroup* const						shaderGroup						= new tcu::TestCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			opGroup->addChild(shaderGroup);

			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(binaryOpTypes); typeNdx++)
			{
				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					const DataType		type			= binaryOpTypes[typeNdx];
					const Precision		precision		= precisions[precNdx];
					const char* const	op				= binaryOps[opNdx].op;
					const bool			useSwizzle		= binaryOps[opNdx].swizzle;
					std::ostringstream	name;

					name << getPrecisionName(precision) << "_" << getDataTypeName(type);

					shaderGroup->addChild(new BinaryOpCase(m_context, name.str().c_str(), "", op, type, precision, useSwizzle, isVertex, shaderGroupCalibrationStorage));
				}
			}
		}
	}

	// Built-in function cases.

	// Non-specific (i.e. includes gentypes) parameter types for the functions.
	enum ValueType
	{
		VALUE_NONE			= 0,
		VALUE_FLOAT			= (1<<0),	// float scalar
		VALUE_FLOAT_VEC		= (1<<1),	// float vector
		VALUE_FLOAT_VEC34	= (1<<2),	// float vector of size 3 or 4
		VALUE_FLOAT_GENTYPE	= (1<<3),	// float scalar/vector
		VALUE_VEC3			= (1<<4),	// vec3 only
		VALUE_VEC4			= (1<<5),	// vec4 only
		VALUE_MATRIX		= (1<<6),	// matrix
		VALUE_BOOL			= (1<<7),	// boolean scalar
		VALUE_BOOL_VEC		= (1<<8),	// boolean vector
		VALUE_BOOL_VEC4		= (1<<9),	// bvec4 only
		VALUE_BOOL_GENTYPE	= (1<<10),	// boolean scalar/vector
		VALUE_INT			= (1<<11),	// int scalar
		VALUE_INT_VEC		= (1<<12),	// int vector
		VALUE_INT_VEC4		= (1<<13),	// ivec4 only
		VALUE_INT_GENTYPE	= (1<<14),	// int scalar/vector

		// Shorthands.
		N				= VALUE_NONE,
		F				= VALUE_FLOAT,
		FV				= VALUE_FLOAT_VEC,
		VL				= VALUE_FLOAT_VEC34, // L for "large"
		GT				= VALUE_FLOAT_GENTYPE,
		V3				= VALUE_VEC3,
		V4				= VALUE_VEC4,
		M				= VALUE_MATRIX,
		B				= VALUE_BOOL,
		BV				= VALUE_BOOL_VEC,
		B4				= VALUE_BOOL_VEC4,
		BGT				= VALUE_BOOL_GENTYPE,
		I				= VALUE_INT,
		IV				= VALUE_INT_VEC,
		I4				= VALUE_INT_VEC4,
		IGT				= VALUE_INT_GENTYPE,

		VALUE_ANY_FLOAT			= VALUE_FLOAT		|	VALUE_FLOAT_VEC		|	VALUE_FLOAT_GENTYPE		| VALUE_VEC3 | VALUE_VEC4 | VALUE_FLOAT_VEC34,
		VALUE_ANY_INT			= VALUE_INT			|	VALUE_INT_VEC		|	VALUE_INT_GENTYPE		| VALUE_INT_VEC4,
		VALUE_ANY_BOOL			= VALUE_BOOL		|	VALUE_BOOL_VEC		|	VALUE_BOOL_GENTYPE		| VALUE_BOOL_VEC4,

		VALUE_ANY_GENTYPE		= VALUE_FLOAT_VEC	|	VALUE_FLOAT_GENTYPE	|	VALUE_FLOAT_VEC34	|
								  VALUE_BOOL_VEC	|	VALUE_BOOL_GENTYPE	|
								  VALUE_INT_VEC		|	VALUE_INT_GENTYPE	|
								  VALUE_MATRIX
	};
	enum PrecisionMask
	{
		PRECMASK_NA				= 0,						//!< Precision not applicable (booleans)
		PRECMASK_LOWP			= (1<<PRECISION_LOWP),
		PRECMASK_MEDIUMP		= (1<<PRECISION_MEDIUMP),
		PRECMASK_HIGHP			= (1<<PRECISION_HIGHP),

		PRECMASK_MEDIUMP_HIGHP	= (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP),
		PRECMASK_ALL			= (1<<PRECISION_LOWP) | (1<<PRECISION_MEDIUMP) | (1<<PRECISION_HIGHP)
	};

	static const DataType floatTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};
	static const DataType intTypes[] =
	{
		TYPE_INT,
		TYPE_INT_VEC2,
		TYPE_INT_VEC3,
		TYPE_INT_VEC4
	};
	static const DataType boolTypes[] =
	{
		TYPE_BOOL,
		TYPE_BOOL_VEC2,
		TYPE_BOOL_VEC3,
		TYPE_BOOL_VEC4
	};
	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	tcu::TestCaseGroup* const angleAndTrigonometryGroup		= new tcu::TestCaseGroup(m_testCtx, "angle_and_trigonometry",	"Built-In Angle and Trigonometry Function Performance Tests");
	tcu::TestCaseGroup* const exponentialGroup				= new tcu::TestCaseGroup(m_testCtx, "exponential",				"Built-In Exponential Function Performance Tests");
	tcu::TestCaseGroup* const commonFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "common_functions",			"Built-In Common Function Performance Tests");
	tcu::TestCaseGroup* const geometricFunctionsGroup		= new tcu::TestCaseGroup(m_testCtx, "geometric",				"Built-In Geometric Function Performance Tests");
	tcu::TestCaseGroup* const matrixFunctionsGroup			= new tcu::TestCaseGroup(m_testCtx, "matrix",					"Built-In Matrix Function Performance Tests");
	tcu::TestCaseGroup* const floatCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "float_compare",			"Built-In Floating Point Comparison Function Performance Tests");
	tcu::TestCaseGroup* const intCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "int_compare",				"Built-In Integer Comparison Function Performance Tests");
	tcu::TestCaseGroup* const boolCompareGroup				= new tcu::TestCaseGroup(m_testCtx, "bool_compare",				"Built-In Boolean Comparison Function Performance Tests");

	addChild(angleAndTrigonometryGroup);
	addChild(exponentialGroup);
	addChild(commonFunctionsGroup);
	addChild(geometricFunctionsGroup);
	addChild(matrixFunctionsGroup);
	addChild(floatCompareGroup);
	addChild(intCompareGroup);
	addChild(boolCompareGroup);

	// Some attributes to be used as parameters for the functions.
	const Vec4 attrPos		= Vec4( 2.3f,  1.9f,  0.8f,  0.7f);
	const Vec4 attrNegPos	= Vec4(-1.3f,  2.5f, -3.5f,	 4.3f);
	const Vec4 attrSmall	= Vec4(-0.9f,  0.8f, -0.4f,	 0.2f);
	const Vec4 attrBig		= Vec4( 1.3f,  2.4f,  3.0f,	 4.0f);

	// \todo The following functions and variants are missing, and should be added in the future:
	//		 - modf (has an output parameter, not currently handled by test code)
	//		 - functions with uint/uvec* return or parameter types
	//		 - non-matrix <-> matrix functions (outerProduct etc.)
	// \note Remember to update test spec when these are added.

	// Function name, return type and parameter type information; also, what attribute should be used in the test.
	// \note Different versions of the same function (i.e. with the same group name) can be defined by putting them successively in this array.
	// \note In order to reduce case count and thus total execution time, we don't test all input type combinations for every function.
	static const struct
	{
		tcu::TestCaseGroup*					parentGroup;
		const char*							groupName;
		const char*							func;
		const ValueType						types[FunctionCase::MAX_PARAMS + 1]; // Return type and parameter types, in that order.
		const Vec4&							attribute;
		int									modifyParamNdx;
		bool								useNearlyConstantInputs;
		bool								booleanCase;
		PrecisionMask						precMask;
	} functionCaseGroups[] =
	{
		{ angleAndTrigonometryGroup,	"radians",			"radians",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"degrees",			"degrees",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"sin",				"sin",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"cos",				"cos",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"tan",				"tan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"asin",				"asin",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"acos",				"acos",				{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan2",			"atan",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atan",				"atan",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"sinh",				"sinh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"cosh",				"cosh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"tanh",				"tanh",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"asinh",			"asinh",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"acosh",			"acosh",			{ F,  F,  N,  N  }, attrBig,		-1, false,	false,	PRECMASK_ALL			},
		{ angleAndTrigonometryGroup,	"atanh",			"atanh",			{ F,  F,  N,  N  }, attrSmall,		-1, true,	false,	PRECMASK_ALL			},

		{ exponentialGroup,				"pow",				"pow",				{ F,  F,  F,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp",				"exp",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log",				"log",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"exp2",				"exp2",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"log2",				"log2",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"sqrt",				"sqrt",				{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},
		{ exponentialGroup,				"inversesqrt",		"inversesqrt",		{ F,  F,  N,  N  }, attrPos,		-1, false,	false,	PRECMASK_ALL			},

		{ commonFunctionsGroup,			"abs",				"abs",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"abs",				"abs",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"sign",				"sign",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"sign",				"sign",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"floor",			"floor",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"floor",			"floor",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"trunc",			"trunc",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"trunc",			"trunc",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"round",			"round",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"round",			"round",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"roundEven",		"roundEven",		{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"roundEven",		"roundEven",		{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"ceil",				"ceil",				{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"fract",			"fract",			{ F,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"fract",			"fract",			{ V4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mod",				"mod",				{ GT, GT, GT, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"min",				"min",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"min",				"min",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"max",				"max",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"max",				"max",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ F,  F,  F,  F  }, attrSmall,		 2, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"clamp",			"clamp",			{ V4, V4, V4, V4 }, attrSmall,		 2, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mix",				"mix",				{ F,  F,  F,  F  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"mix",				"mix",				{ V4, V4, V4, V4 }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"mix",				"mix",				{ F,  F,  F,  B  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"mix",				"mix",				{ V4, V4, V4, B4 }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"step",				"step",				{ F,  F,  F,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"step",				"step",				{ V4, V4, V4, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ F,  F,  F,  F  }, attrSmall,		 1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"smoothstep",		"smoothstep",		{ V4, V4, V4, V4 }, attrSmall,		 1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"isnan",			"isnan",			{ B,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"isnan",			"isnan",			{ B4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"isinf",			"isinf",			{ B,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"isinf",			"isinf",			{ B4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"floatBitsToInt",	"floatBitsToInt",	{ I,  F,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"floatBitsToInt",	"floatBitsToInt",	{ I4, V4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ commonFunctionsGroup,			"intBitsToFloat",	"intBitsToFloat",	{ F,  I,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_MEDIUMP_HIGHP	},
		{ commonFunctionsGroup,			"intBitsToFloat",	"intBitsToFloat",	{ V4, I4, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ geometricFunctionsGroup,		"length",			"length",			{ F,  VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"distance",			"distance",			{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"dot",				"dot",				{ F,  VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"cross",			"cross",			{ V3, V3, V3, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"normalize",		"normalize",		{ VL, VL, N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"faceforward",		"faceforward",		{ VL, VL, VL, VL }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"reflect",			"reflect",			{ VL, VL, VL, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ geometricFunctionsGroup,		"refract",			"refract",			{ VL, VL, VL, F  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ matrixFunctionsGroup,			"matrixCompMult",	"matrixCompMult",	{ M,  M,  M,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ matrixFunctionsGroup,			"transpose",		"transpose",		{ M,  M,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ matrixFunctionsGroup,			"inverse",			"inverse",			{ M,  M,  N,  N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ floatCompareGroup,			"lessThan",			"lessThan",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"lessThanEqual",	"lessThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThan",		"greaterThan",		{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"greaterThanEqual",	"greaterThanEqual",	{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"equal",			"equal",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ floatCompareGroup,			"notEqual",			"notEqual",			{ BV, FV, FV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ intCompareGroup,				"lessThan",			"lessThan",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"lessThanEqual",	"lessThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThan",		"greaterThan",		{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"greaterThanEqual",	"greaterThanEqual",	{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"equal",			"equal",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},
		{ intCompareGroup,				"notEqual",			"notEqual",			{ BV, IV, IV, N  }, attrNegPos,		-1, false,	false,	PRECMASK_ALL			},

		{ boolCompareGroup,				"equal",			"equal",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"notEqual",			"notEqual",			{ BV, BV, BV, N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"any",				"any",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"all",				"all",				{ B,  BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		},
		{ boolCompareGroup,				"not",				"not",				{ BV, BV, N,  N  }, attrNegPos,		-1, false,	true,	PRECMASK_MEDIUMP		}
	};

	// vertexSubGroup and fragmentSubGroup are the groups where the various vertex/fragment cases of a single function are added.
	// \note These are defined here so that different versions (different entries in the functionCaseGroups array) of the same function can be put in the same group.
	tcu::TestCaseGroup*							vertexSubGroup		= DE_NULL;
	tcu::TestCaseGroup*							fragmentSubGroup	= DE_NULL;
	FunctionCase::InitialCalibrationStorage		vertexSubGroupCalibrationStorage;
	FunctionCase::InitialCalibrationStorage		fragmentSubGroupCalibrationStorage;
	for (int funcNdx = 0; funcNdx < DE_LENGTH_OF_ARRAY(functionCaseGroups); funcNdx++)
	{
		tcu::TestCaseGroup* const	parentGroup					= functionCaseGroups[funcNdx].parentGroup;
		const char* const			groupName					= functionCaseGroups[funcNdx].groupName;
		const char* const			groupFunc					= functionCaseGroups[funcNdx].func;
		const ValueType* const		funcTypes					= functionCaseGroups[funcNdx].types;
		const Vec4&					groupAttribute				= functionCaseGroups[funcNdx].attribute;
		const int					modifyParamNdx				= functionCaseGroups[funcNdx].modifyParamNdx;
		const bool					useNearlyConstantInputs		= functionCaseGroups[funcNdx].useNearlyConstantInputs;
		const bool					booleanCase					= functionCaseGroups[funcNdx].booleanCase;
		const PrecisionMask			precMask					= functionCaseGroups[funcNdx].precMask;

		// If this is a new function and not just a different version of the previously defined function, create a new group.
		if (funcNdx == 0 || parentGroup != functionCaseGroups[funcNdx-1].parentGroup || string(groupName) != functionCaseGroups[funcNdx-1].groupName)
		{
			tcu::TestCaseGroup* const funcGroup = new tcu::TestCaseGroup(m_testCtx, groupName, "");
			functionCaseGroups[funcNdx].parentGroup->addChild(funcGroup);

			vertexSubGroup		= new tcu::TestCaseGroup(m_testCtx, "vertex", "");
			fragmentSubGroup	= new tcu::TestCaseGroup(m_testCtx, "fragment", "");

			funcGroup->addChild(vertexSubGroup);
			funcGroup->addChild(fragmentSubGroup);

			vertexSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
			fragmentSubGroupCalibrationStorage	= FunctionCase::InitialCalibrationStorage(new FunctionCase::InitialCalibration);
		}

		DE_ASSERT(vertexSubGroup != DE_NULL);
		DE_ASSERT(fragmentSubGroup != DE_NULL);

		// Find the type size range of parameters (e.g. from 2 to 4 in case of vectors).
		int genTypeFirstSize	= 1;
		int genTypeLastSize		= 1;

		// Find the first return value or parameter with a gentype (if any) and set sizes accordingly.
		// \note Assumes only matching sizes gentypes are to be found, e.g. no "genType func (vec param)"
		for (int i = 0; i < FunctionCase::MAX_PARAMS + 1 && genTypeLastSize == 1; i++)
		{
			switch (funcTypes[i])
			{
				case VALUE_FLOAT_VEC:
				case VALUE_BOOL_VEC:
				case VALUE_INT_VEC:			// \note Fall-through.
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_VEC34:
					genTypeFirstSize = 3;
					genTypeLastSize = 4;
					break;
				case VALUE_FLOAT_GENTYPE:
				case VALUE_BOOL_GENTYPE:
				case VALUE_INT_GENTYPE:		// \note Fall-through.
					genTypeFirstSize = 1;
					genTypeLastSize = 4;
					break;
				case VALUE_MATRIX:
					genTypeFirstSize = 2;
					genTypeLastSize = 4;
					break;
				// If none of the above, keep looping.
				default:
					break;
			}
		}

		// Create a case for each possible size of the gentype.
		for (int curSize = genTypeFirstSize; curSize <= genTypeLastSize; curSize++)
		{
			// Determine specific types for return value and the parameters, according to curSize. Non-gentypes not affected by curSize.
			DataType types[FunctionCase::MAX_PARAMS + 1];
			for (int i = 0; i < FunctionCase::MAX_PARAMS + 1; i++)
			{
				if (funcTypes[i] == VALUE_NONE)
					types[i] = TYPE_INVALID;
				else
				{
					int isFloat	= funcTypes[i] & VALUE_ANY_FLOAT;
					int isBool	= funcTypes[i] & VALUE_ANY_BOOL;
					int isInt	= funcTypes[i] & VALUE_ANY_INT;
					int isMat	= funcTypes[i] == VALUE_MATRIX;
					int inSize	= (funcTypes[i] & VALUE_ANY_GENTYPE)	? curSize
								: funcTypes[i] == VALUE_VEC3			? 3
								: funcTypes[i] == VALUE_VEC4			? 4
								: funcTypes[i] == VALUE_BOOL_VEC4		? 4
								: funcTypes[i] == VALUE_INT_VEC4		? 4
								: 1;
					int			typeArrayNdx = isMat ? inSize - 2 : inSize - 1; // \note No matrices of size 1.

					types[i]	= isFloat	? floatTypes[typeArrayNdx]
								: isBool	? boolTypes[typeArrayNdx]
								: isInt		? intTypes[typeArrayNdx]
								: isMat		? matrixTypes[typeArrayNdx]
								: TYPE_LAST;
				}

				DE_ASSERT(types[i] != TYPE_LAST);
			}

			// Array for just the parameter types.
			DataType paramTypes[FunctionCase::MAX_PARAMS];
			for (int i = 0; i < FunctionCase::MAX_PARAMS; i++)
				paramTypes[i] = types[i+1];

			for (int prec = (int)PRECISION_LOWP; prec < (int)PRECISION_LAST; prec++)
			{
				if ((precMask & (1 << prec)) == 0)
					continue;

				const string		precisionPrefix = booleanCase ? "" : (string(getPrecisionName((Precision)prec)) + "_");
				std::ostringstream	caseName;

				caseName << precisionPrefix;

				// Write the name of each distinct parameter data type into the test case name.
				for (int i = 1; i < FunctionCase::MAX_PARAMS + 1 && types[i] != TYPE_INVALID; i++)
				{
					if (i == 1 || types[i] != types[i-1])
					{
						if (i > 1)
							caseName << "_";

						caseName << getDataTypeName(types[i]);
					}
				}

				for (int fragI = 0; fragI <= 1; fragI++)
				{
					const bool					vert	= fragI == 0;
					tcu::TestCaseGroup* const	group	= vert ? vertexSubGroup : fragmentSubGroup;
					group->addChild	(new FunctionCase(m_context,
													  caseName.str().c_str(), "",
													  groupFunc,
													  types[0], paramTypes,
													  groupAttribute, modifyParamNdx, useNearlyConstantInputs,
													  (Precision)prec, vert,
													  vert ? vertexSubGroupCalibrationStorage : fragmentSubGroupCalibrationStorage));
				}
			}
		}
	}
}